

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *window,int n)

{
  ImU32 IVar1;
  int in_ESI;
  long in_RDI;
  ImGuiID id;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = in_RDI;
  if ((in_ESI < 0) || (7 < in_ESI)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x13c6,"GetWindowResizeID","ImGui ASSERT FAILED: %s","n >= 0 && n <= 7");
  }
  IVar1 = ImHashStr("#RESIZE",0,*(ImU32 *)(local_8 + 8));
  IVar1 = ImHashData(local_c,4,IVar1);
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n <= 7);
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}